

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::AddSegmentAsFallback<segment_command,section>
               (string_view command_data,string_view file_data,RangeSink *sink)

{
  long *plVar1;
  ulong uVar2;
  size_t *psVar3;
  size_type *psVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  string_view name;
  string_view name_00;
  size_t *local_c8;
  char *local_c0;
  size_t local_b8;
  char *pcStack_b0;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char *local_68;
  size_t local_60;
  size_t local_58;
  char *local_50;
  RangeSink *local_48;
  char *local_40;
  ulong local_38;
  
  local_40 = file_data._M_str;
  pcVar5 = command_data._M_str;
  local_48 = sink;
  if (command_data._M_len < 0x38) {
LAB_001901e4:
    Throw("Premature EOF reading Mach-O data.",0x36);
  }
  if (*(int *)(pcVar5 + 0x28) != 0) {
    local_50 = pcVar5 + 8;
    local_60 = file_data._M_len;
    local_58 = strnlen(local_50,0x10);
    iVar7 = *(int *)(pcVar5 + 0x30);
    local_68 = pcVar5;
    if (iVar7 != 0) {
      uVar8 = command_data._M_len - 0x38;
      pcVar5 = pcVar5 + 0x38;
      do {
        local_38 = uVar8 - 0x44;
        if (uVar8 < 0x44) goto LAB_001901e4;
        uVar8 = (ulong)*(uint *)(pcVar5 + 0x24);
        if (((byte)pcVar5[0x38] < 0x13) && ((0x41002U >> ((byte)pcVar5[0x38] & 0x1f) & 1) != 0)) {
          uVar8 = 0;
        }
        local_b8 = strnlen(pcVar5,0x10);
        local_c8 = (size_t *)local_58;
        local_c0 = local_50;
        pcStack_b0 = pcVar5;
        absl::strings_internal::
        JoinAlgorithm<std::basic_string_view<char,std::char_traits<char>>const*,void>
                  (&label,(strings_internal *)&local_c8,&label,1,",");
        std::operator+(&local_88,"[",&label);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar3 = (size_t *)(plVar1 + 2);
        if ((size_t *)*plVar1 == psVar3) {
          local_b8 = *psVar3;
          pcStack_b0 = (char *)plVar1[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *psVar3;
          local_c8 = (size_t *)*plVar1;
        }
        local_c0 = (char *)plVar1[1];
        *plVar1 = (long)psVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::operator=((string *)&label,(string *)&local_c8);
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        uVar2 = (ulong)*(uint *)(pcVar5 + 0x28);
        if (local_60 < uVar8 + uVar2) {
          Throw("region out-of-bounds",0x5d);
        }
        uVar6 = local_60 - uVar2;
        if (uVar8 <= local_60 - uVar2) {
          uVar6 = uVar8;
        }
        name._M_str = label._M_dataplus._M_p;
        name._M_len = label._M_string_length;
        RangeSink::AddRange(local_48,"macho_fallback",name,(ulong)*(uint *)(pcVar5 + 0x20),
                            (ulong)*(uint *)(pcVar5 + 0x24),
                            (uint64_t)(local_40 + (uVar2 - (long)(local_48->file_->data_)._M_str)),
                            uVar6);
        uVar8 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)label._M_dataplus._M_p != &label.field_2) {
          operator_delete(label._M_dataplus._M_p,label.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = pcVar5 + 0x44;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,local_50,local_50 + local_58);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x37640f);
    pcVar5 = local_68;
    psVar4 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar4) {
      label.field_2._M_allocated_capacity = *psVar4;
      label.field_2._8_8_ = plVar1[3];
      label._M_dataplus._M_p = (pointer)&label.field_2;
    }
    else {
      label.field_2._M_allocated_capacity = *psVar4;
      label._M_dataplus._M_p = (pointer)*plVar1;
    }
    label._M_string_length = plVar1[1];
    *plVar1 = (long)psVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&label);
    psVar3 = (size_t *)(plVar1 + 2);
    if ((size_t *)*plVar1 == psVar3) {
      local_b8 = *psVar3;
      pcStack_b0 = (char *)plVar1[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *psVar3;
      local_c8 = (size_t *)*plVar1;
    }
    local_c0 = (char *)plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    uVar8 = (ulong)*(uint *)(pcVar5 + 0x20);
    uVar2 = (ulong)*(uint *)(pcVar5 + 0x24);
    if (local_60 < uVar2 + uVar8) {
      Throw("region out-of-bounds",0x5d);
    }
    uVar6 = local_60 - uVar8;
    if (uVar2 <= local_60 - uVar8) {
      uVar6 = uVar2;
    }
    name_00._M_str = (char *)local_c8;
    name_00._M_len = (size_t)local_c0;
    RangeSink::AddRange(local_48,"macho_fallback",name_00,(ulong)*(uint *)(pcVar5 + 0x18),
                        (ulong)*(uint *)(pcVar5 + 0x1c),
                        (uint64_t)(local_40 + (uVar8 - (long)(local_48->file_->data_)._M_str)),uVar6
                       );
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)label._M_dataplus._M_p != &label.field_2) {
      operator_delete(label._M_dataplus._M_p,label.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void AddSegmentAsFallback(string_view command_data, string_view file_data,
                          RangeSink* sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&command_data);

  if (segment->maxprot == VM_PROT_NONE) {
    return;
  }

  string_view segname = ArrayToStr(segment->segname, 16);

  uint32_t nsects = segment->nsects;
  for (uint32_t j = 0; j < nsects; j++) {
    auto section = GetStructPointerAndAdvance<Section>(&command_data);

    // filesize equals vmsize unless the section is zerofill
    uint64_t filesize = section->size;
    switch (section->flags & SECTION_TYPE) {
      case S_ZEROFILL:
      case S_GB_ZEROFILL:
      case S_THREAD_LOCAL_ZEROFILL:
        filesize = 0;
        break;
      default:
        break;
    }

    std::string label = absl::StrJoin(
        std::make_tuple(segname, ArrayToStr(section->sectname, 16)), ",");
    label = "[" + label + "]";
    sink->AddRange("macho_fallback", label, section->addr, section->size,
                   StrictSubstr(file_data, section->offset, filesize));
  }

  sink->AddRange("macho_fallback", "[" + std::string(segname) + "]",
                 segment->vmaddr, segment->vmsize,
                 StrictSubstr(file_data, segment->fileoff, segment->filesize));
}